

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cpp
# Opt level: O0

void __thiscall SpanList::popFront(SpanList *this)

{
  Span *pSVar1;
  Span *tmp;
  SpanList *this_local;
  
  if (this->list->next == this->list) {
    this->list = (Span *)0x0;
  }
  else {
    pSVar1 = this->list->next;
    this->list->prev->next = this->list->next;
    this->list->next->prev = this->list->prev;
    this->list = pSVar1;
  }
  return;
}

Assistant:

void SpanList::popFront() {
  if (list->next == list) { // 如果链表只有一个元素, 那么直接让它指向空指针
    list = nullptr;
  } else {
    auto tmp = list->next;
    list->prev->next = list->next;
    list->next->prev = list->prev;

    list = tmp; // 非常重要!
  }
}